

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_zip.c
# Opt level: O1

int ZIPVGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  uint uVar1;
  uint8_t *puVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 *puVar5;
  
  puVar2 = tif->tif_data;
  if (tag == 0x10022) {
    uVar3 = *(undefined4 *)(puVar2 + 0xf8);
  }
  else {
    if (tag != 0x10015) {
      iVar4 = (**(code **)(puVar2 + 0x100))();
      return iVar4;
    }
    uVar3 = *(undefined4 *)(puVar2 + 0xf0);
  }
  uVar1 = ap->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
    ap->gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar5 + 1;
  }
  *(undefined4 *)*puVar5 = uVar3;
  return 1;
}

Assistant:

static int ZIPVGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    ZIPState *sp = ZState(tif);

    switch (tag)
    {
        case TIFFTAG_ZIPQUALITY:
            *va_arg(ap, int *) = sp->zipquality;
            break;

        case TIFFTAG_DEFLATE_SUBCODEC:
            *va_arg(ap, int *) = sp->subcodec;
            break;

        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
    return (1);
}